

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise1D::forward
          (ConvolutionDepthWise1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  Mat bottom_blob_bordered;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  ConvolutionDepthWise1D *in_stack_fffffffffffffe80;
  int *piVar2;
  long *plVar3;
  
  piVar2 = (int *)0x0;
  plVar3 = (long *)0x0;
  make_padding(in_stack_fffffffffffffe80,
               (Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (Option *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (piVar2 != (int *)0x0) {
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((iVar1 == 1) && (plVar3 != (long *)0x0)) {
      (**(code **)(*plVar3 + 0x18))(plVar3,0);
    }
  }
  return -100;
}

Assistant:

int ConvolutionDepthWise1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise1d(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}